

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

void Eto63_2(Clifford *p)

{
  vector<Blade,_std::allocator<Blade>_> local_240;
  vector<Blade,_std::allocator<Blade>_> local_228;
  Clifford local_210;
  vector<Blade,_std::allocator<Blade>_> local_1f8;
  Clifford local_1e0;
  vector<Blade,_std::allocator<Blade>_> local_1c8;
  Clifford local_1b0;
  Clifford local_198;
  Clifford local_180;
  Clifford local_168;
  vector<Blade,_std::allocator<Blade>_> local_150;
  Clifford local_138;
  Clifford local_120;
  vector<Blade,_std::allocator<Blade>_> local_108;
  vector<Blade,_std::allocator<Blade>_> local_f0;
  Clifford local_d8;
  float local_bc;
  undefined1 local_b8 [4];
  float z;
  vector<Blade,_std::allocator<Blade>_> local_a0;
  Clifford local_88;
  float local_70 [2];
  float y;
  vector<Blade,_std::allocator<Blade>_> local_60;
  vector<Blade,_std::allocator<Blade>_> local_48;
  Clifford local_30;
  float local_14;
  Clifford *pCStack_10;
  float x;
  Clifford *p_local;
  
  pCStack_10 = p;
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_48,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_60,&e1);
  operator|(&local_30,&local_48,&local_60);
  operator<=(&local_14,&local_30);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_30);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_60);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_48);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_a0,pCStack_10);
  std::vector<Blade,_std::allocator<Blade>_>::vector
            ((vector<Blade,_std::allocator<Blade>_> *)local_b8,&e2);
  operator|(&local_88,&local_a0,(Clifford *)local_b8);
  operator<=(local_70,&local_88);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_88);
  std::vector<Blade,_std::allocator<Blade>_>::~vector
            ((vector<Blade,_std::allocator<Blade>_> *)local_b8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_f0,pCStack_10);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_108,&e3);
  operator|(&local_d8,&local_f0,&local_108);
  operator<=(&local_bc,&local_d8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_108);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_f0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_150,pCStack_10);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1c8,&ex);
  operator*(&local_1b0,local_14 * local_14,&local_1c8);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_1f8,&ey);
  operator*(&local_1e0,local_70[0] * local_70[0],&local_1f8);
  operator+(&local_198,&local_1b0,&local_1e0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_228,&ez);
  operator*(&local_210,local_bc * local_bc,&local_228);
  operator+(&local_180,&local_198,&local_210);
  operator*(&local_168,0.5,&local_180);
  operator+(&local_138,&local_150,&local_168);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_240,&eo);
  operator+(&local_120,&local_138,&local_240);
  std::vector<Blade,_std::allocator<Blade>_>::operator=(pCStack_10,&local_120);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_120);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_240);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_138);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_168);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_180);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_210);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_228);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_198);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1e0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1f8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1b0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_1c8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_150);
  return;
}

Assistant:

void Eto63_2(Clifford &p)
{
   float x;x<=(p|e1);
   float y;y<=(p|e2);
   float z;z<=(p|e3);
   p=p+0.5*(x*x*ex+y*y*ey+z*z*ez)+eo;//+x*y*(ex+ey)+x*z*(ex+ez)+z*y*(ex+ez)+eo;
}